

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_mips.cpp
# Opt level: O2

bool GlobalJudgeMips(string *str)

{
  bool bVar1;
  regex re;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(&re,"g\\d+",0x10);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (str,&re,0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&re);
  return bVar1;
}

Assistant:

bool GlobalJudgeMips(const string& str) {
    std::regex re("g\\d+");
    return std::regex_match(str, re);
}